

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::
InitDefaultSignature<Diligent::SHADER_TYPE,bool>
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,
          PipelineResourceSignatureDesc *SignDesc,SHADER_TYPE *ExtraArgs,bool *ExtraArgs_1)

{
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> RVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  RenderDeviceVkImpl *this_00;
  PipelineResourceSignatureVkImpl *pPVar4;
  char (*Args_1) [48];
  PipelineResourceSignatureVkImpl *pObj;
  SignatureAutoPtrType *this_01;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> pImplicitSignature;
  string msg;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> local_50;
  undefined1 local_48 [32];
  
  if ((this->m_SignatureCount != '\x01') || (this->m_UsingImplicitSignature == false)) {
    FormatString<char[26],char[50]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_SignatureCount == 1 && m_UsingImplicitSignature",
               (char (*) [50])ExtraArgs_1);
    DebugAssertionFailed
              ((Char *)local_48._0_8_,"InitDefaultSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x478);
    if ((undefined1 *)local_48._0_8_ != local_48 + 0x10) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
  }
  local_50.m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
  this_00 = DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                       );
  local_48._8_8_ = &local_50;
  local_48._0_8_ = local_50.m_pObject;
  Args_1 = (char (*) [48])(ulong)*ExtraArgs;
  RenderDeviceVkImpl::CreatePipelineResourceSignature
            (this_00,SignDesc,(IPipelineResourceSignature **)local_48,*ExtraArgs,*ExtraArgs_1);
  uVar3 = local_48._8_8_;
  uVar2 = local_48._0_8_;
  if (((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)local_48._8_8_ !=
       (RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)0x0) &&
     (*(PipelineResourceSignatureVkImpl **)local_48._8_8_ !=
      (PipelineResourceSignatureVkImpl *)local_48._0_8_)) {
    RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::Release
              ((RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl> *)local_48._8_8_);
    *(PipelineResourceSignatureVkImpl **)uVar3 = (PipelineResourceSignatureVkImpl *)uVar2;
  }
  if (local_50.m_pObject == (PipelineResourceSignatureVkImpl *)0x0) {
    Args_1 = (char (*) [48])0x47e;
    LogError<true,char[66],char_const*,char[3]>
              (false,"InitDefaultSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x47e,(char (*) [66])
                      "Failed to create implicit resource signature for pipeline state \'",
               (char **)&(this->
                         super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
                         ).m_Desc,(char (*) [3])"\'.");
  }
  if (((local_50.m_pObject)->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      .m_Desc.BindingIndex != '\0') {
    FormatString<char[26],char[48]>
              ((string *)local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pImplicitSignature->GetDesc().BindingIndex == 0",Args_1);
    DebugAssertionFailed
              ((Char *)local_48._0_8_,"InitDefaultSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x480);
    if ((PipelineResourceSignatureVkImpl *)local_48._0_8_ !=
        (PipelineResourceSignatureVkImpl *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
  }
  this_01 = this->m_Signatures;
  if (this_01->m_pObject == (PipelineResourceSignatureVkImpl *)0x0) {
    pPVar4 = (PipelineResourceSignatureVkImpl *)0x0;
  }
  else {
    FormatString<char[42]>
              ((string *)local_48,(char (*) [42])"Signature 0 has already been initialized.");
    DebugAssertionFailed
              ((Char *)local_48._0_8_,"InitDefaultSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x481);
    if ((PipelineResourceSignatureVkImpl *)local_48._0_8_ !=
        (PipelineResourceSignatureVkImpl *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ + 1);
    }
    this_01 = this->m_Signatures;
    pPVar4 = this_01->m_pObject;
  }
  RVar1.m_pObject = local_50.m_pObject;
  if (pPVar4 != local_50.m_pObject) {
    local_50.m_pObject = (PipelineResourceSignatureVkImpl *)0x0;
    RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::Release(this_01);
    this_01->m_pObject = RVar1.m_pObject;
  }
  RefCntAutoPtr<Diligent::PipelineResourceSignatureVkImpl>::Release(&local_50);
  return;
}

Assistant:

void InitDefaultSignature(const PipelineResourceSignatureDesc& SignDesc,
                              const ExtraArgsType&... ExtraArgs)
    {
        VERIFY_EXPR(m_SignatureCount == 1 && m_UsingImplicitSignature);

        RefCntAutoPtr<PipelineResourceSignatureImplType> pImplicitSignature;
        this->GetDevice()->CreatePipelineResourceSignature(SignDesc, pImplicitSignature.template DblPtr<IPipelineResourceSignature>(), ExtraArgs...);

        if (!pImplicitSignature)
            LOG_ERROR_AND_THROW("Failed to create implicit resource signature for pipeline state '", this->m_Desc.Name, "'.");

        VERIFY_EXPR(pImplicitSignature->GetDesc().BindingIndex == 0);
        VERIFY(!m_Signatures[0], "Signature 0 has already been initialized.");
        m_Signatures[0] = std::move(pImplicitSignature);
    }